

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCountFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr pxVar1;
  xmlXPathObjectPtr cur;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
              ((ctxt->value->type != XPATH_NODESET && (ctxt->value->type != XPATH_XSLT_TREE)))) {
        xmlXPathErr(ctxt,0xb);
      }
      else {
        obj = xmlXPathValuePop(ctxt);
        if ((obj == (xmlXPathObjectPtr)0x0) || (obj->nodesetval == (xmlNodeSetPtr)0x0)) {
          pxVar1 = xmlXPathCacheNewFloat(ctxt,0.0);
          xmlXPathValuePush(ctxt,pxVar1);
        }
        else {
          pxVar1 = xmlXPathCacheNewFloat(ctxt,(double)obj->nodesetval->nodeNr);
          xmlXPathValuePush(ctxt,pxVar1);
        }
        xmlXPathReleaseObject(ctxt->context,obj);
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathCountFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur == NULL) || (cur->nodesetval == NULL))
	xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt, 0.0));
    else
	xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt,
	    (double) cur->nodesetval->nodeNr));
    xmlXPathReleaseObject(ctxt->context, cur);
}